

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O0

void __thiscall libDAI::JTree::runShaferShenoy(JTree *this)

{
  ulong uVar1;
  bool bVar2;
  reference pvVar3;
  reference puVar4;
  TFactor<double> *pTVar5;
  size_t sVar6;
  R_nb_t *this_00;
  reference pvVar7;
  size_type sVar8;
  long *in_RDI;
  double dVar9;
  size_t beta;
  R_nb_cit k_2;
  Factor piet_2;
  size_t alpha;
  R_nb_cit k_1;
  Factor piet_1;
  size_t j_1;
  size_t i_1;
  size_t e_1;
  R_nb_cit k;
  Factor piet;
  size_t j;
  size_t i;
  size_t e;
  undefined4 in_stack_fffffffffffffc88;
  NormType in_stack_fffffffffffffc8c;
  RegionGraph *in_stack_fffffffffffffc90;
  RegionGraph *this_01;
  TFactor<double> *in_stack_fffffffffffffc98;
  JTree *in_stack_fffffffffffffca0;
  double in_stack_fffffffffffffcc0;
  TFactor<double> *in_stack_fffffffffffffcc8;
  TFactor<double> *in_stack_fffffffffffffce8;
  TFactor<double> *in_stack_fffffffffffffcf0;
  TFactor<double> *in_stack_fffffffffffffcf8;
  TFactor<double> *pTVar10;
  VarSet *in_stack_fffffffffffffd30;
  TFactor<double> *in_stack_fffffffffffffd38;
  ulong local_208;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_1b0 [8];
  TFactor<double> *local_170;
  unsigned_long *local_130;
  unsigned_long *local_128;
  unsigned_long *local_120;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_118 [8];
  size_t local_d8;
  size_t local_d0;
  ulong local_c8;
  unsigned_long *local_88;
  unsigned_long *local_80;
  unsigned_long *local_68;
  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60 [8];
  size_t local_20;
  size_t local_18;
  size_type local_10;
  
  in_RDI[0x4b] = 0;
  local_10 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f));
  while (sVar8 = local_10 - 1, local_10 != 0) {
    local_10 = sVar8;
    pvVar3 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        sVar8);
    local_18 = pvVar3->n2;
    pvVar3 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        local_10);
    local_20 = pvVar3->n1;
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::OR(in_stack_fffffffffffffc90,
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
    ;
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::nbOR(in_stack_fffffffffffffc90,
                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_68 = (unsigned_long *)
               std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                          CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffffc90,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    while( true ) {
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbOR(in_stack_fffffffffffffc90,
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_80 = (unsigned_long *)
                 std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_60);
      if (*puVar4 != local_10) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_60);
        message(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
                (size_t)in_stack_fffffffffffffc90);
        TFactor<double>::operator*=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
      local_88 = (unsigned_long *)
                 __gnu_cxx::
                 __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                               *)in_stack_fffffffffffffc98,
                              (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
    }
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IR(in_stack_fffffffffffffc90,
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::partSum(in_stack_fffffffffffffd38,in_stack_fffffffffffffd30);
    message(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
            (size_t)in_stack_fffffffffffffc90);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffc90,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffc90);
    message(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
            (size_t)in_stack_fffffffffffffc90);
    dVar9 = TFactor<double>::normalize
                      ((TFactor<double> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
    dVar9 = log(dVar9);
    in_RDI[0x4b] = (long)(dVar9 + (double)in_RDI[0x4b]);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffc90);
  }
  local_10 = sVar8;
  for (local_c8 = 0; uVar1 = local_c8,
      sVar8 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::size
                        ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f)),
      uVar1 < sVar8; local_c8 = local_c8 + 1) {
    pvVar3 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        local_c8);
    local_d0 = pvVar3->n1;
    pvVar3 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                       ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),
                        local_c8);
    local_d8 = pvVar3->n2;
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::OR(in_stack_fffffffffffffc90,
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
    ;
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::nbOR(in_stack_fffffffffffffc90,
                      CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    local_120 = (unsigned_long *)
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                          ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffffc90,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    while( true ) {
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbOR(in_stack_fffffffffffffc90,
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      local_128 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (!bVar2) break;
      puVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*(local_118);
      if (*puVar4 != local_c8) {
        __gnu_cxx::
        __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator*(local_118);
        message(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
                (size_t)in_stack_fffffffffffffc90);
        TFactor<double>::operator*=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      }
      local_130 = (unsigned_long *)
                  __gnu_cxx::
                  __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                *)in_stack_fffffffffffffc98,
                               (int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
    }
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IR(in_stack_fffffffffffffc90,
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::marginal
              (in_stack_fffffffffffffcf8,&in_stack_fffffffffffffcf0->_vs,
               SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
    message(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
            (size_t)in_stack_fffffffffffffc90);
    TFactor<double>::operator=
              ((TFactor<double> *)in_stack_fffffffffffffc90,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffc90);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffc90);
  }
  local_170 = (TFactor<double> *)0x0;
  while( true ) {
    pTVar10 = local_170;
    (**(code **)(*in_RDI + 0x28))();
    pTVar5 = (TFactor<double> *)RegionGraph::nr_ORs((RegionGraph *)0xb64985);
    if (pTVar5 <= pTVar10) break;
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::OR(in_stack_fffffffffffffc90,
                    CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::TFactor((TFactor<double> *)in_stack_fffffffffffffca0,in_stack_fffffffffffffc98)
    ;
    in_stack_fffffffffffffcf0 = (TFactor<double> *)(**(code **)(*in_RDI + 0x28))();
    in_stack_fffffffffffffce8 =
         (TFactor<double> *)
         RegionGraph::nbOR(in_stack_fffffffffffffc90,
                           CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    __gnu_cxx::
    __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
    ::__normal_iterator<unsigned_long*>
              ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)in_stack_fffffffffffffc90,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    while( true ) {
      (**(code **)(*in_RDI + 0x28))();
      RegionGraph::nbOR(in_stack_fffffffffffffc90,
                        CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffc90,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
      if (!bVar2) break;
      in_stack_fffffffffffffcc8 = local_170;
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(local_1b0);
      message(in_stack_fffffffffffffca0,(size_t)in_stack_fffffffffffffc98,
              (size_t)in_stack_fffffffffffffc90);
      TFactor<double>::operator*=(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
      __gnu_cxx::
      __normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)in_stack_fffffffffffffc98,(int)((ulong)in_stack_fffffffffffffc90 >> 0x20));
    }
    bVar2 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::empty
                      ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)
                       in_stack_fffffffffffffca0);
    pTVar10 = local_170;
    if (bVar2) {
      in_stack_fffffffffffffcc0 =
           TFactor<double>::normalize
                     ((TFactor<double> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
      dVar9 = log(in_stack_fffffffffffffcc0);
      in_RDI[0x4b] = (long)((double)in_RDI[0x4b] + dVar9);
      std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                 (in_RDI + 0x42),(size_type)local_170);
      TFactor<double>::operator=
                ((TFactor<double> *)in_stack_fffffffffffffc90,
                 (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    }
    else {
      pvVar3 = std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator[]
                         ((vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *)(in_RDI + 0x3f),0
                         );
      if (pTVar10 == (TFactor<double> *)pvVar3->n1) {
        dVar9 = TFactor<double>::normalize
                          ((TFactor<double> *)in_stack_fffffffffffffc90,in_stack_fffffffffffffc8c);
        dVar9 = log(dVar9);
        in_RDI[0x4b] = (long)((double)in_RDI[0x4b] + dVar9);
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   (in_RDI + 0x42),(size_type)local_170);
        TFactor<double>::operator=
                  ((TFactor<double> *)in_stack_fffffffffffffc90,
                   (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
        ;
      }
      else {
        TFactor<double>::normalized
                  (in_stack_fffffffffffffcc8,(NormType)((ulong)in_stack_fffffffffffffcc0 >> 0x20));
        std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                  ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
                   (in_RDI + 0x42),(size_type)local_170);
        TFactor<double>::operator=
                  ((TFactor<double> *)in_stack_fffffffffffffc90,
                   (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88))
        ;
        TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffc90);
      }
    }
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffc90);
    local_170 = (TFactor<double> *)
                ((long)&(local_170->_vs)._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start + 1);
  }
  local_208 = 0;
  while( true ) {
    (**(code **)(*in_RDI + 0x28))();
    sVar6 = RegionGraph::nr_IRs((RegionGraph *)0xb64d06);
    if (sVar6 <= local_208) break;
    this_01 = (RegionGraph *)(in_RDI + 0x42);
    (**(code **)(*in_RDI + 0x28))();
    this_00 = RegionGraph::nbIR(this_01,CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88
                                                ));
    pvVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](this_00,0);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)this_01
               ,*pvVar7);
    (**(code **)(*in_RDI + 0x28))();
    RegionGraph::IR(this_01,CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::marginal
              (pTVar10,&in_stack_fffffffffffffcf0->_vs,
               SUB81((ulong)in_stack_fffffffffffffce8 >> 0x38,0));
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               (in_RDI + 0x45),local_208);
    TFactor<double>::operator=
              ((TFactor<double> *)this_01,
               (TFactor<double> *)CONCAT44(in_stack_fffffffffffffc8c,in_stack_fffffffffffffc88));
    TFactor<double>::~TFactor((TFactor<double> *)this_01);
    local_208 = local_208 + 1;
  }
  return;
}

Assistant:

void JTree::runShaferShenoy() {
        // First pass
        _logZ = 0.0;
        for( size_t e = _RTree.size(); (e--) != 0; ) {
            // send a message from _RTree[e].n2 to _RTree[e].n1
            // or, actually, from the seperator IR(e) to _RTree[e].n1

            size_t i = _RTree[e].n2;
            size_t j = _RTree[e].n1;
            
            Factor piet = grm().OR(i);
            for( RegionGraph::R_nb_cit k = grm().nbOR(i).begin(); k != grm().nbOR(i).end(); k++ )
                if( *k != e )
                    piet *= message( i, *k );
            message( j, e ) = piet.partSum( grm().IR(e) );
            _logZ += log( message(j,e).normalize() );
        }

        // Second pass
        for( size_t e = 0; e < _RTree.size(); e++ ) {
            size_t i = _RTree[e].n1;
            size_t j = _RTree[e].n2;
            
            Factor piet = grm().OR(i);
            for( RegionGraph::R_nb_cit k = grm().nbOR(i).begin(); k != grm().nbOR(i).end(); k++ )
                if( *k != e )
                    piet *= message( i, *k );
            message( j, e ) = piet.marginal( grm().IR(e) );
        }

        // Calculate beliefs
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            Factor piet = grm().OR(alpha);
            for( RegionGraph::R_nb_cit k = grm().nbOR(alpha).begin(); k != grm().nbOR(alpha).end(); k++ )
                piet *= message( alpha, *k );
            if( _RTree.empty() ) {
                _logZ += log( piet.normalize() );
                _Qa[alpha] = piet;
            } else if( alpha == _RTree[0].n1 ) {
                _logZ += log( piet.normalize() );
                _Qa[alpha] = piet;
            } else
                _Qa[alpha] = piet.normalized();
        }

        // Only for logZ (and for belief)...
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ ) 
            _Qb[beta] = _Qa[grm().nbIR(beta)[0]].marginal( grm().IR(beta) );
    }